

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

void __thiscall Liby::TimerQueue::~TimerQueue(TimerQueue *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::~vector
            (&(this->queue_).heap);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr
            (&this->timerChan_);
  this_00 = (this->timerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

TimerQueue::~TimerQueue() {
#ifdef __linux__
    //　使timerChan_析构时不去调用Poller虚基类的虚函数
    if (timerChan_) {
        //        timerChan_->setPoller(nullptr);
    }
#endif
}